

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scp.c
# Opt level: O0

LIBSSH2_CHANNEL *
scp_send(LIBSSH2_SESSION *session,char *path,int mode,libssh2_int64_t size,time_t mtime,time_t atime
        )

{
  int iVar1;
  int iVar2;
  size_t sVar3;
  uchar *puVar4;
  size_t __n;
  LIBSSH2_CHANNEL *pLVar5;
  ssize_t sVar6;
  size_t buflen;
  char *pcVar7;
  char *err_msg;
  size_t err_len;
  char *base;
  size_t path_len;
  char *tmp_err_msg;
  int tmp_err_code;
  int rc;
  size_t cmd_len;
  time_t atime_local;
  time_t mtime_local;
  libssh2_int64_t size_local;
  int mode_local;
  char *path_local;
  LIBSSH2_SESSION *session_local;
  
  if (session->scpSend_state == libssh2_NB_state_idle) {
    sVar3 = strlen(path);
    session->scpSend_command_len = sVar3 * 3 + 10 + (long)(int)(uint)(mtime != 0 || atime != 0);
    puVar4 = (uchar *)(*session->alloc)(session->scpSend_command_len,&session->abstract);
    session->scpSend_command = puVar4;
    if (session->scpSend_command == (uchar *)0x0) {
      _libssh2_error(session,-6,"Unable to allocate a command buffer for SCP session");
      return (LIBSSH2_CHANNEL *)0x0;
    }
    pcVar7 = "";
    if (mtime != 0 || atime != 0) {
      pcVar7 = "p";
    }
    snprintf((char *)session->scpSend_command,session->scpSend_command_len,"scp -%st ",pcVar7);
    sVar3 = strlen((char *)session->scpSend_command);
    if ((session->flag).quote_paths == 0) {
      __n = strlen(path);
      memcpy(session->scpSend_command + sVar3,path,__n);
    }
    else {
      __n = shell_quotearg(path,session->scpSend_command + sVar3,
                           session->scpSend_command_len - sVar3);
    }
    _tmp_err_code = __n + sVar3;
    session->scpSend_command_len = _tmp_err_code;
    session->scpSend_state = libssh2_NB_state_created;
  }
  if (session->scpSend_state == libssh2_NB_state_created) {
    pLVar5 = _libssh2_channel_open(session,"session",7,0x200000,0x8000,(uchar *)0x0,0);
    session->scpSend_channel = pLVar5;
    if (session->scpSend_channel == (LIBSSH2_CHANNEL *)0x0) {
      iVar1 = libssh2_session_last_errno(session);
      if (iVar1 == -0x25) {
        _libssh2_error(session,-0x25,"Would block starting up channel");
      }
      else {
        (*session->free)(session->scpSend_command,&session->abstract);
        session->scpSend_command = (uchar *)0x0;
        session->scpSend_state = libssh2_NB_state_idle;
      }
      return (LIBSSH2_CHANNEL *)0x0;
    }
    session->scpSend_state = libssh2_NB_state_sent;
  }
  if (session->scpSend_state == libssh2_NB_state_sent) {
    iVar1 = _libssh2_channel_process_startup
                      (session->scpSend_channel,"exec",4,(char *)session->scpSend_command,
                       session->scpSend_command_len);
    if (iVar1 == -0x25) {
      _libssh2_error(session,-0x25,"Would block requesting SCP startup");
      return (LIBSSH2_CHANNEL *)0x0;
    }
    if (iVar1 != 0) {
      (*session->free)(session->scpSend_command,&session->abstract);
      session->scpSend_command = (uchar *)0x0;
      _libssh2_error(session,-0x1c,"Unknown error while getting error string");
      goto LAB_0013251a;
    }
    (*session->free)(session->scpSend_command,&session->abstract);
    session->scpSend_command = (uchar *)0x0;
    session->scpSend_state = libssh2_NB_state_sent1;
  }
  if (session->scpSend_state == libssh2_NB_state_sent1) {
    sVar6 = _libssh2_channel_read(session->scpSend_channel,0,(char *)session->scpSend_response,1);
    iVar1 = (int)sVar6;
    if (iVar1 == -0x25) {
      _libssh2_error(session,-0x25,"Would block waiting for response from remote");
      return (LIBSSH2_CHANNEL *)0x0;
    }
    if (iVar1 < 0) {
      _libssh2_error(session,iVar1,"SCP failure");
      goto LAB_0013251a;
    }
    if (iVar1 != 0) {
      if (session->scpSend_response[0] != '\0') {
        _libssh2_error(session,-0x1c,"Invalid ACK response from remote");
        goto LAB_0013251a;
      }
      if ((mtime != 0) || (atime != 0)) {
        iVar1 = snprintf((char *)session->scpSend_response,0x100,"T%ld 0 %ld 0\n",mtime,atime);
        session->scpSend_response_len = (long)iVar1;
      }
      session->scpSend_state = libssh2_NB_state_sent2;
      goto LAB_001320b4;
    }
  }
  else {
LAB_001320b4:
    if ((mtime == 0) && (atime == 0)) {
      if (session->scpSend_state == libssh2_NB_state_sent2) {
        session->scpSend_state = libssh2_NB_state_sent4;
      }
    }
    else {
      if (session->scpSend_state == libssh2_NB_state_sent2) {
        sVar6 = _libssh2_channel_write
                          (session->scpSend_channel,0,session->scpSend_response,
                           session->scpSend_response_len);
        if ((int)sVar6 == -0x25) {
          _libssh2_error(session,-0x25,"Would block sending time data for SCP file");
          return (LIBSSH2_CHANNEL *)0x0;
        }
        if ((int)sVar6 != (int)session->scpSend_response_len) {
          _libssh2_error(session,-7,"Unable to send time data for SCP file");
          goto LAB_0013251a;
        }
        session->scpSend_state = libssh2_NB_state_sent3;
      }
      if (session->scpSend_state == libssh2_NB_state_sent3) {
        sVar6 = _libssh2_channel_read
                          (session->scpSend_channel,0,(char *)session->scpSend_response,1);
        iVar1 = (int)sVar6;
        if (iVar1 == -0x25) {
          _libssh2_error(session,-0x25,"Would block waiting for response");
          return (LIBSSH2_CHANNEL *)0x0;
        }
        if (iVar1 < 0) {
          _libssh2_error(session,iVar1,"SCP failure");
          goto LAB_0013251a;
        }
        if (iVar1 == 0) goto LAB_001324db;
        if (session->scpSend_response[0] != '\0') {
          _libssh2_error(session,-0x1c,"Invalid SCP ACK response");
          goto LAB_0013251a;
        }
        session->scpSend_state = libssh2_NB_state_sent4;
      }
    }
    if (session->scpSend_state == libssh2_NB_state_sent4) {
      pcVar7 = strrchr(path,0x2f);
      err_len = (size_t)path;
      if (pcVar7 != (char *)0x0) {
        err_len = (size_t)(pcVar7 + 1);
      }
      iVar1 = snprintf((char *)session->scpSend_response,0x100,"C0%o %lld %s\n",(ulong)(uint)mode,
                       size,err_len);
      session->scpSend_response_len = (long)iVar1;
      session->scpSend_state = libssh2_NB_state_sent5;
    }
    if (session->scpSend_state == libssh2_NB_state_sent5) {
      sVar6 = _libssh2_channel_write
                        (session->scpSend_channel,0,session->scpSend_response,
                         session->scpSend_response_len);
      if ((int)sVar6 == -0x25) {
        _libssh2_error(session,-0x25,"Would block send core file data for SCP file");
        return (LIBSSH2_CHANNEL *)0x0;
      }
      if ((int)sVar6 != (int)session->scpSend_response_len) {
        _libssh2_error(session,-7,"Unable to send core file data for SCP file");
        goto LAB_0013251a;
      }
      session->scpSend_state = libssh2_NB_state_sent6;
    }
    if (session->scpSend_state != libssh2_NB_state_sent6) {
LAB_001324b9:
      session->scpSend_state = libssh2_NB_state_idle;
      return session->scpSend_channel;
    }
    sVar6 = _libssh2_channel_read(session->scpSend_channel,0,(char *)session->scpSend_response,1);
    iVar1 = (int)sVar6;
    if (iVar1 == -0x25) {
      _libssh2_error(session,-0x25,"Would block waiting for response");
      return (LIBSSH2_CHANNEL *)0x0;
    }
    if (iVar1 < 0) {
      _libssh2_error(session,-0x1c,"Invalid ACK response from remote");
      goto LAB_0013251a;
    }
    if (iVar1 != 0) {
      if (session->scpSend_response[0] == '\0') goto LAB_001324b9;
      buflen = _libssh2_channel_packet_data_len(session->scpSend_channel,0);
      pcVar7 = (char *)(*session->alloc)(buflen + 1,&session->abstract);
      if (pcVar7 == (char *)0x0) {
        _libssh2_error(session,-6,"failed to get memory");
      }
      else {
        sVar6 = _libssh2_channel_read(session->scpSend_channel,0,pcVar7,buflen);
        if (0 < (int)sVar6) {
          pcVar7[buflen] = '\0';
        }
        (*session->free)(pcVar7,&session->abstract);
        _libssh2_error(session,-0x1c,"failed to send file");
      }
      goto LAB_0013251a;
    }
  }
LAB_001324db:
  iVar1 = libssh2_channel_eof(session->scpSend_channel);
  if (iVar1 == 0) {
    return session->scpSend_channel;
  }
  _libssh2_error(session,-0x1c,"Unexpected channel close");
LAB_0013251a:
  iVar1 = session->err_code;
  pcVar7 = session->err_msg;
  do {
    iVar2 = libssh2_channel_free(session->scpSend_channel);
  } while (iVar2 == -0x25);
  session->err_code = iVar1;
  session->err_msg = pcVar7;
  session->scpSend_channel = (LIBSSH2_CHANNEL *)0x0;
  session->scpSend_state = libssh2_NB_state_idle;
  return (LIBSSH2_CHANNEL *)0x0;
}

Assistant:

static LIBSSH2_CHANNEL *
scp_send(LIBSSH2_SESSION * session, const char *path, int mode,
         libssh2_int64_t size, time_t mtime, time_t atime)
{
    size_t cmd_len;
    int rc;
    int tmp_err_code;
    const char *tmp_err_msg;

    if(session->scpSend_state == libssh2_NB_state_idle) {
        session->scpSend_command_len =
            _libssh2_shell_quotedsize(path) + sizeof("scp -t ") +
            ((mtime || atime) ? 1 : 0);

        session->scpSend_command =
            LIBSSH2_ALLOC(session, session->scpSend_command_len);

        if(!session->scpSend_command) {
            _libssh2_error(session, LIBSSH2_ERROR_ALLOC,
                           "Unable to allocate a command buffer for "
                           "SCP session");
            return NULL;
        }

        snprintf((char *)session->scpSend_command,
                 session->scpSend_command_len,
                 "scp -%st ", (mtime || atime) ? "p" : "");

        cmd_len = strlen((char *)session->scpSend_command);

        if(!session->flag.quote_paths) {
            size_t path_len;

            path_len = strlen(path);

            /* no NUL-termination needed, so memcpy will do */
            memcpy(&session->scpSend_command[cmd_len], path, path_len);
            cmd_len += path_len;

        }
        else {
            cmd_len += shell_quotearg(path,
                                      &session->scpSend_command[cmd_len],
                                      session->scpSend_command_len - cmd_len);
        }

        /* the command to exec should _not_ be NUL-terminated */
        session->scpSend_command_len = cmd_len;

        _libssh2_debug((session, LIBSSH2_TRACE_SCP,
                       "Opening channel for SCP send"));
        /* Allocate a channel */

        session->scpSend_state = libssh2_NB_state_created;
    }

    if(session->scpSend_state == libssh2_NB_state_created) {
        session->scpSend_channel =
            _libssh2_channel_open(session, "session", sizeof("session") - 1,
                                  LIBSSH2_CHANNEL_WINDOW_DEFAULT,
                                  LIBSSH2_CHANNEL_PACKET_DEFAULT, NULL, 0);
        if(!session->scpSend_channel) {
            if(libssh2_session_last_errno(session) != LIBSSH2_ERROR_EAGAIN) {
                /* previous call set libssh2_session_last_error(), pass it
                   through */
                LIBSSH2_FREE(session, session->scpSend_command);
                session->scpSend_command = NULL;
                session->scpSend_state = libssh2_NB_state_idle;
            }
            else {
                _libssh2_error(session, LIBSSH2_ERROR_EAGAIN,
                               "Would block starting up channel");
            }
            return NULL;
        }

        session->scpSend_state = libssh2_NB_state_sent;
    }

    if(session->scpSend_state == libssh2_NB_state_sent) {
        /* Request SCP for the desired file */
        rc = _libssh2_channel_process_startup(session->scpSend_channel, "exec",
                                              sizeof("exec") - 1,
                                              (char *)session->scpSend_command,
                                              session->scpSend_command_len);
        if(rc == LIBSSH2_ERROR_EAGAIN) {
            _libssh2_error(session, LIBSSH2_ERROR_EAGAIN,
                           "Would block requesting SCP startup");
            return NULL;
        }
        else if(rc) {
            /* previous call set libssh2_session_last_error(), pass it
               through */
            LIBSSH2_FREE(session, session->scpSend_command);
            session->scpSend_command = NULL;
            _libssh2_error(session, LIBSSH2_ERROR_SCP_PROTOCOL,
                           "Unknown error while getting error string");
            goto scp_send_error;
        }
        LIBSSH2_FREE(session, session->scpSend_command);
        session->scpSend_command = NULL;

        session->scpSend_state = libssh2_NB_state_sent1;
    }

    if(session->scpSend_state == libssh2_NB_state_sent1) {
        /* Wait for ACK */
        rc = (int)_libssh2_channel_read(session->scpSend_channel, 0,
                                        (char *) session->scpSend_response, 1);
        if(rc == LIBSSH2_ERROR_EAGAIN) {
            _libssh2_error(session, LIBSSH2_ERROR_EAGAIN,
                           "Would block waiting for response from remote");
            return NULL;
        }
        else if(rc < 0) {
            _libssh2_error(session, rc, "SCP failure");
            goto scp_send_error;
        }
        else if(!rc)
            /* remain in the same state */
            goto scp_send_empty_channel;
        else if(session->scpSend_response[0]) {
            _libssh2_error(session, LIBSSH2_ERROR_SCP_PROTOCOL,
                           "Invalid ACK response from remote");
            goto scp_send_error;
        }
        if(mtime || atime) {
            /* Send mtime and atime to be used for file */
            session->scpSend_response_len =
                snprintf((char *) session->scpSend_response,
                         LIBSSH2_SCP_RESPONSE_BUFLEN, "T%ld 0 %ld 0\n",
                         (long)mtime, (long)atime);
            _libssh2_debug((session, LIBSSH2_TRACE_SCP, "Sent %s",
                           session->scpSend_response));
        }

        session->scpSend_state = libssh2_NB_state_sent2;
    }

    /* Send mtime and atime to be used for file */
    if(mtime || atime) {
        if(session->scpSend_state == libssh2_NB_state_sent2) {
            rc = (int)_libssh2_channel_write(session->scpSend_channel, 0,
                                             session->scpSend_response,
                                             session->scpSend_response_len);
            if(rc == LIBSSH2_ERROR_EAGAIN) {
                _libssh2_error(session, LIBSSH2_ERROR_EAGAIN,
                               "Would block sending time data for SCP file");
                return NULL;
            }
            else if(rc != (int)session->scpSend_response_len) {
                _libssh2_error(session, LIBSSH2_ERROR_SOCKET_SEND,
                               "Unable to send time data for SCP file");
                goto scp_send_error;
            }

            session->scpSend_state = libssh2_NB_state_sent3;
        }

        if(session->scpSend_state == libssh2_NB_state_sent3) {
            /* Wait for ACK */
            rc = (int)_libssh2_channel_read(session->scpSend_channel, 0,
                                            (char *) session->scpSend_response,
                                            1);
            if(rc == LIBSSH2_ERROR_EAGAIN) {
                _libssh2_error(session, LIBSSH2_ERROR_EAGAIN,
                               "Would block waiting for response");
                return NULL;
            }
            else if(rc < 0) {
                _libssh2_error(session, rc, "SCP failure");
                goto scp_send_error;
            }
            else if(!rc)
                /* remain in the same state */
                goto scp_send_empty_channel;
            else if(session->scpSend_response[0]) {
                _libssh2_error(session, LIBSSH2_ERROR_SCP_PROTOCOL,
                               "Invalid SCP ACK response");
                goto scp_send_error;
            }

            session->scpSend_state = libssh2_NB_state_sent4;
        }
    }
    else {
        if(session->scpSend_state == libssh2_NB_state_sent2) {
            session->scpSend_state = libssh2_NB_state_sent4;
        }
    }

    if(session->scpSend_state == libssh2_NB_state_sent4) {
        /* Send mode, size, and basename */
        const char *base = strrchr(path, '/');
        if(base)
            base++;
        else
            base = path;

        session->scpSend_response_len =
            snprintf((char *) session->scpSend_response,
                     LIBSSH2_SCP_RESPONSE_BUFLEN, "C0%o %"
                     LIBSSH2_INT64_T_FORMAT " %s\n", mode,
                     size, base);
        _libssh2_debug((session, LIBSSH2_TRACE_SCP, "Sent %s",
                       session->scpSend_response));

        session->scpSend_state = libssh2_NB_state_sent5;
    }

    if(session->scpSend_state == libssh2_NB_state_sent5) {
        rc = (int)_libssh2_channel_write(session->scpSend_channel, 0,
                                         session->scpSend_response,
                                         session->scpSend_response_len);
        if(rc == LIBSSH2_ERROR_EAGAIN) {
            _libssh2_error(session, LIBSSH2_ERROR_EAGAIN,
                           "Would block send core file data for SCP file");
            return NULL;
        }
        else if(rc != (int)session->scpSend_response_len) {
            _libssh2_error(session, LIBSSH2_ERROR_SOCKET_SEND,
                           "Unable to send core file data for SCP file");
            goto scp_send_error;
        }

        session->scpSend_state = libssh2_NB_state_sent6;
    }

    if(session->scpSend_state == libssh2_NB_state_sent6) {
        /* Wait for ACK */
        rc = (int)_libssh2_channel_read(session->scpSend_channel, 0,
                                        (char *) session->scpSend_response,
                                        1);
        if(rc == LIBSSH2_ERROR_EAGAIN) {
            _libssh2_error(session, LIBSSH2_ERROR_EAGAIN,
                           "Would block waiting for response");
            return NULL;
        }
        else if(rc < 0) {
            _libssh2_error(session, LIBSSH2_ERROR_SCP_PROTOCOL,
                           "Invalid ACK response from remote");
            goto scp_send_error;
        }
        else if(rc == 0)
            goto scp_send_empty_channel;

        else if(session->scpSend_response[0]) {
            size_t err_len;
            char *err_msg;

            err_len =
                _libssh2_channel_packet_data_len(session->scpSend_channel, 0);
            err_msg = LIBSSH2_ALLOC(session, err_len + 1);
            if(!err_msg) {
                _libssh2_error(session, LIBSSH2_ERROR_ALLOC,
                               "failed to get memory");
                goto scp_send_error;
            }

            /* Read the remote error message */
            rc = (int)_libssh2_channel_read(session->scpSend_channel, 0,
                                            err_msg, err_len);
            if(rc > 0) {
                err_msg[err_len] = 0;
                _libssh2_debug((session, LIBSSH2_TRACE_SCP,
                               "got %02x %s", session->scpSend_response[0],
                               err_msg));
            }
            LIBSSH2_FREE(session, err_msg);
            _libssh2_error(session, LIBSSH2_ERROR_SCP_PROTOCOL,
                           "failed to send file");
            goto scp_send_error;
        }
    }

    session->scpSend_state = libssh2_NB_state_idle;
    return session->scpSend_channel;

scp_send_empty_channel:
    /* the code only jumps here as a result of a zero read from channel_read()
       so we check EOF status to avoid getting stuck in a loop */
    if(libssh2_channel_eof(session->scpSend_channel)) {
        _libssh2_error(session, LIBSSH2_ERROR_SCP_PROTOCOL,
                       "Unexpected channel close");
    }
    else
        return session->scpSend_channel;
    /* fall-through */
scp_send_error:
    tmp_err_code = session->err_code;
    tmp_err_msg = session->err_msg;
    while(libssh2_channel_free(session->scpSend_channel) ==
          LIBSSH2_ERROR_EAGAIN);
    session->err_code = tmp_err_code;
    session->err_msg = tmp_err_msg;
    session->scpSend_channel = NULL;
    session->scpSend_state = libssh2_NB_state_idle;
    return NULL;
}